

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineObjectHelper.cc
# Opt level: O0

string * __thiscall
QPDFOutlineObjectHelper::getTitle_abi_cxx11_
          (string *__return_storage_ptr__,QPDFOutlineObjectHelper *this)

{
  bool bVar1;
  allocator<char> local_c9;
  string local_c8 [32];
  undefined1 local_a8 [32];
  string local_88;
  allocator<char> local_61;
  string local_60;
  undefined1 local_19;
  element_type *local_18;
  QPDFOutlineObjectHelper *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = (element_type *)this;
  this_local = (QPDFOutlineObjectHelper *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xffffffffffffffd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"/Title",&local_61);
  bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&stack0xffffffffffffffd0,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd0);
  if (bVar1) {
    QPDFObjectHelper::oh((QPDFObjectHelper *)local_a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_c8,"/Title",&local_c9);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_a8 + 0x10),(string *)local_a8);
    QPDFObjectHandle::getUTF8Value_abi_cxx11_
              ((string *)(local_a8 + 0x20),(QPDFObjectHandle *)(local_a8 + 0x10));
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)(local_a8 + 0x20));
    std::__cxx11::string::~string((string *)(local_a8 + 0x20));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_a8 + 0x10));
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFOutlineObjectHelper::getTitle()
{
    std::string result;
    if (oh().hasKey("/Title")) {
        result = oh().getKey("/Title").getUTF8Value();
    }
    return result;
}